

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.c
# Opt level: O2

ion_err_t dictionary_close(ion_dictionary_t *dictionary)

{
  int key_size;
  int value_size;
  ion_key_type_t key_type;
  ion_dictionary_id_t id;
  ion_dictionary_parent_t *piVar1;
  code *pcVar2;
  ion_dictionary_compare_t p_Var3;
  _func_ion_err_t_ion_dictionary_t_ptr *p_Var4;
  ion_key_t pvVar5;
  ion_value_t pvVar6;
  ion_err_t iVar7;
  byte bVar8;
  char cVar9;
  ion_key_t pvVar10;
  ion_key_size_t extraout_EDX;
  ion_dictionary_handler_t *piVar11;
  undefined8 uStack_f0;
  ion_dictionary_size_t aiStack_e8 [2];
  undefined8 uStack_e0;
  undefined1 auStack_d8 [16];
  ion_dictionary_handler_t fallback_handler;
  ion_predicate_t predicate;
  ion_dictionary_t fallback_dict;
  ion_record_t record;
  ion_dict_cursor_t *cursor;
  
  if (dictionary->status != '\x01') {
    uStack_e0 = 0x105978;
    iVar7 = (*dictionary->handler->close_dictionary)(dictionary);
    if (iVar7 != '\0') {
      if (iVar7 != '\x0f') {
        return iVar7;
      }
      record.value = (ion_value_t)0x0;
      uStack_e0 = 0x1059a8;
      dictionary_build_predicate((ion_predicate_t *)&fallback_handler.close_dictionary,'\x02');
      uStack_e0 = 0x1059b8;
      iVar7 = (*dictionary->handler->find)
                        (dictionary,(ion_predicate_t *)&fallback_handler.close_dictionary,
                         (ion_dict_cursor_t **)&record.value);
      if (iVar7 != '\0') {
        return iVar7;
      }
      piVar1 = dictionary->instance;
      key_size = (piVar1->record).key_size;
      value_size = (piVar1->record).value_size;
      key_type = piVar1->key_type;
      fallback_dict.handler =
           (ion_dictionary_handler_t *)(auStack_d8 + -((long)key_size + 0xfU & 0xfffffffffffffff0));
      pvVar10 = (ion_key_t)
                ((long)fallback_dict.handler - ((long)value_size + 0xfU & 0xfffffffffffffff0));
      record.key = pvVar10;
      *(undefined8 *)((long)pvVar10 + -8) = 0x105a0a;
      ffdict_init((ion_dictionary_handler_t *)(auStack_d8 + 8));
      id = dictionary->instance->id;
      *(undefined8 *)((long)pvVar10 + -0x10) = 1;
      *(undefined8 *)((long)pvVar10 + -0x18) = 0x105a2c;
      iVar7 = dictionary_create((ion_dictionary_handler_t *)(auStack_d8 + 8),
                                (ion_dictionary_t *)&predicate.destroy,id,key_type,key_size,
                                value_size,*(ion_dictionary_size_t *)((long)pvVar10 + -0x10));
      if (iVar7 != '\0') {
        return iVar7;
      }
      while( true ) {
        pvVar6 = record.value;
        pcVar2 = *(code **)((long)record.value + 0x18);
        *(undefined8 *)((long)pvVar10 + -8) = 0x105a4e;
        bVar8 = (*pcVar2)(pvVar6,&fallback_dict.handler);
        pvVar5 = record.key;
        piVar11 = fallback_dict.handler;
        if ((bVar8 != 4) && (bVar8 != 2)) break;
        pcVar2 = *(code **)fallback_dict.instance;
        *(undefined8 *)((long)pvVar10 + -8) = 0x105a6b;
        cVar9 = (*pcVar2)(&predicate.destroy,piVar11,pvVar5);
        if (cVar9 != '\0') {
          pcVar2 = *(code **)((long)record.value + 0x20);
          *(undefined8 *)((long)pvVar10 + -8) = 0x105a7d;
          (*pcVar2)();
          p_Var3 = fallback_dict.instance[1].compare;
          *(undefined8 *)((long)pvVar10 + -8) = 0x105a88;
          (*p_Var3)(&predicate.destroy,piVar11,extraout_EDX);
          return cVar9;
        }
      }
      if ((bVar8 & 0xfd) != 1) {
        return '\x12';
      }
      pcVar2 = *(code **)((long)record.value + 0x20);
      *(undefined8 *)((long)pvVar10 + -8) = 0x105a9d;
      (*pcVar2)();
      *(undefined8 *)((long)pvVar10 + -8) = 0x105aa6;
      iVar7 = dictionary_close((ion_dictionary_t *)&predicate.destroy);
      if (iVar7 != '\0') {
        return iVar7;
      }
      p_Var4 = dictionary->handler->delete_dictionary;
      *(undefined8 *)((long)pvVar10 + -8) = 0x105ab4;
      iVar7 = (*p_Var4)(dictionary);
      if (iVar7 != '\0') {
        return iVar7;
      }
    }
    dictionary->status = '\x01';
  }
  return '\0';
}

Assistant:

ion_err_t
dictionary_close(
	ion_dictionary_t *dictionary
) {
	if (ion_dictionary_status_closed == dictionary->status) {
		return err_ok;
	}

	ion_err_t error = dictionary->handler->close_dictionary(dictionary);

	if (err_not_implemented == error) {
		ion_predicate_t		predicate;
		ion_dict_cursor_t	*cursor = NULL;
		ion_record_t		record;
		ion_err_t			err;

		dictionary_build_predicate(&predicate, predicate_all_records);
		err = dictionary_find(dictionary, &predicate, &cursor);

		if (err_ok != err) {
			return err;
		}

		int				key_size	= dictionary->instance->record.key_size;
		int				value_size	= dictionary->instance->record.value_size;
		ion_key_type_t	key_type	= dictionary->instance->key_type;

		record.key		= alloca(key_size);
		record.value	= alloca(value_size);

		ion_dictionary_handler_t	fallback_handler;
		ion_dictionary_t			fallback_dict;

		ffdict_init(&fallback_handler);

		err = dictionary_create(&fallback_handler, &fallback_dict, dictionary->instance->id, key_type, key_size, value_size, 1);

		if (err_ok != err) {
			return err;
		}

		ion_cursor_status_t cursor_status;

		while (cs_cursor_active == (cursor_status = cursor->next(cursor, &record)) || cs_cursor_initialized == cursor_status) {
			ion_status_t status = dictionary_insert(&fallback_dict, record.key, record.value);

			if (err_ok != status.error) {
				cursor->destroy(&cursor);
				dictionary_delete_dictionary(&fallback_dict);
				return status.error;
			}
		}

		/* Cursor has either reached the end of the result set or there was no
		   result set to traverse, and the cursor remains uninitialized. */
		if ((cs_end_of_results != cursor_status) && (cs_cursor_uninitialized != cursor_status)) {
			return err_uninitialized;
		}

		cursor->destroy(&cursor);

		err = dictionary_close(&fallback_dict);

		if (err_ok != err) {
			return err;
		}

		err = dictionary_delete_dictionary(dictionary);

		if (err_ok != err) {
			return err;
		}

		error = err_ok;
	}

	if (err_ok == error) {
		dictionary->status = ion_dictionary_status_closed;
	}

	return error;
}